

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool InputTextFilterCharacter
               (uint *p_char,ImGuiInputTextFlags flags,ImGuiInputTextCallback callback,
               void *user_data,ImGuiInputSource input_source)

{
  bool bVar1;
  int iVar2;
  undefined1 local_88 [8];
  ImGuiInputTextCallbackData callback_data;
  uint c_decimal_point;
  ImGuiContext *g;
  uint local_38;
  bool pass;
  bool apply_named_filters;
  uint c;
  ImGuiInputSource input_source_local;
  void *user_data_local;
  ImGuiInputTextCallback callback_local;
  ImGuiInputTextFlags flags_local;
  uint *p_char_local;
  
  if (input_source != ImGuiInputSource_Keyboard && input_source != ImGuiInputSource_Clipboard) {
    __assert_fail("input_source == ImGuiInputSource_Keyboard || input_source == ImGuiInputSource_Clipboard"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0xf11,
                  "bool InputTextFilterCharacter(unsigned int *, ImGuiInputTextFlags, ImGuiInputTextCallback, void *, ImGuiInputSource)"
                 );
  }
  local_38 = *p_char;
  bVar1 = true;
  if (local_38 < 0x20) {
    if ((local_38 != 10 || (flags & 0x4000000U) == 0) && (local_38 != 9 || (flags & 0x400U) == 0)) {
      return false;
    }
    bVar1 = false;
  }
  if (input_source != ImGuiInputSource_Clipboard) {
    if (local_38 == 0x7f) {
      return false;
    }
    if ((0xdfff < local_38) && (local_38 < 0xf900)) {
      return false;
    }
  }
  if (0xffff < local_38) {
    return false;
  }
  if ((bVar1) && ((flags & 0x2000fU) != 0)) {
    callback_data.SelectionEnd = (int)GImGui->PlatformLocaleDecimalPoint;
    if ((((flags & 1U) != 0) &&
        (((local_38 < 0x30 || (0x39 < local_38)) && (local_38 != callback_data.SelectionEnd)))) &&
       ((((local_38 != 0x2d && (local_38 != 0x2b)) && (local_38 != 0x2a)) && (local_38 != 0x2f)))) {
      return false;
    }
    if ((((flags & 0x20000U) != 0) && ((local_38 < 0x30 || (0x39 < local_38)))) &&
       ((local_38 != callback_data.SelectionEnd &&
        (((((local_38 != 0x2d && (local_38 != 0x2b)) && (local_38 != 0x2a)) &&
          ((local_38 != 0x2f && (local_38 != 0x65)))) && (local_38 != 0x45)))))) {
      return false;
    }
    if (((((flags & 2U) != 0) && ((local_38 < 0x30 || (0x39 < local_38)))) &&
        ((local_38 < 0x61 || (0x66 < local_38)))) && ((local_38 < 0x41 || (0x46 < local_38)))) {
      return false;
    }
    if ((((flags & 4U) != 0) && (0x60 < local_38)) && (local_38 < 0x7b)) {
      local_38 = local_38 - 0x20;
      *p_char = local_38;
    }
    if (((flags & 8U) != 0) && (bVar1 = ImCharIsBlankW(local_38), bVar1)) {
      return false;
    }
  }
  if ((flags & 0x200U) != 0) {
    ImGuiInputTextCallbackData::ImGuiInputTextCallbackData((ImGuiInputTextCallbackData *)local_88);
    memset(local_88,0,0x38);
    local_88._0_4_ = 0x200;
    callback_data.UserData._0_2_ = (ushort)local_38;
    local_88._4_4_ = flags;
    callback_data._0_8_ = user_data;
    iVar2 = (*callback)((ImGuiInputTextCallbackData *)local_88);
    if (iVar2 != 0) {
      return false;
    }
    *p_char = (uint)(ushort)callback_data.UserData;
    if ((ushort)callback_data.UserData == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool InputTextFilterCharacter(unsigned int* p_char, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data, ImGuiInputSource input_source)
{
    IM_ASSERT(input_source == ImGuiInputSource_Keyboard || input_source == ImGuiInputSource_Clipboard);
    unsigned int c = *p_char;

    // Filter non-printable (NB: isprint is unreliable! see #2467)
    bool apply_named_filters = true;
    if (c < 0x20)
    {
        bool pass = false;
        pass |= (c == '\n' && (flags & ImGuiInputTextFlags_Multiline));
        pass |= (c == '\t' && (flags & ImGuiInputTextFlags_AllowTabInput));
        if (!pass)
            return false;
        apply_named_filters = false; // Override named filters below so newline and tabs can still be inserted.
    }

    if (input_source != ImGuiInputSource_Clipboard)
    {
        // We ignore Ascii representation of delete (emitted from Backspace on OSX, see #2578, #2817)
        if (c == 127)
            return false;

        // Filter private Unicode range. GLFW on OSX seems to send private characters for special keys like arrow keys (FIXME)
        if (c >= 0xE000 && c <= 0xF8FF)
            return false;
    }

    // Filter Unicode ranges we are not handling in this build
    if (c > IM_UNICODE_CODEPOINT_MAX)
        return false;

    // Generic named filters
    if (apply_named_filters && (flags & (ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase | ImGuiInputTextFlags_CharsNoBlank | ImGuiInputTextFlags_CharsScientific)))
    {
        // The libc allows overriding locale, with e.g. 'setlocale(LC_NUMERIC, "de_DE.UTF-8");' which affect the output/input of printf/scanf.
        // The standard mandate that programs starts in the "C" locale where the decimal point is '.'.
        // We don't really intend to provide widespread support for it, but out of empathy for people stuck with using odd API, we support the bare minimum aka overriding the decimal point.
        // Change the default decimal_point with:
        //   ImGui::GetCurrentContext()->PlatformLocaleDecimalPoint = *localeconv()->decimal_point;
        ImGuiContext& g = *GImGui;
        const unsigned c_decimal_point = (unsigned int)g.PlatformLocaleDecimalPoint;

        // Allow 0-9 . - + * /
        if (flags & ImGuiInputTextFlags_CharsDecimal)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/'))
                return false;

        // Allow 0-9 . - + * / e E
        if (flags & ImGuiInputTextFlags_CharsScientific)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/') && (c != 'e') && (c != 'E'))
                return false;

        // Allow 0-9 a-F A-F
        if (flags & ImGuiInputTextFlags_CharsHexadecimal)
            if (!(c >= '0' && c <= '9') && !(c >= 'a' && c <= 'f') && !(c >= 'A' && c <= 'F'))
                return false;

        // Turn a-z into A-Z
        if (flags & ImGuiInputTextFlags_CharsUppercase)
            if (c >= 'a' && c <= 'z')
                *p_char = (c += (unsigned int)('A' - 'a'));

        if (flags & ImGuiInputTextFlags_CharsNoBlank)
            if (ImCharIsBlankW(c))
                return false;
    }

    // Custom callback filter
    if (flags & ImGuiInputTextFlags_CallbackCharFilter)
    {
        ImGuiInputTextCallbackData callback_data;
        memset(&callback_data, 0, sizeof(ImGuiInputTextCallbackData));
        callback_data.EventFlag = ImGuiInputTextFlags_CallbackCharFilter;
        callback_data.EventChar = (ImWchar)c;
        callback_data.Flags = flags;
        callback_data.UserData = user_data;
        if (callback(&callback_data) != 0)
            return false;
        *p_char = callback_data.EventChar;
        if (!callback_data.EventChar)
            return false;
    }

    return true;
}